

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::SymbolsWrapper::setTo(SymbolsWrapper *this,DecimalFormatSymbols *dfs)

{
  DecimalFormatSymbols *pDVar1;
  DecimalFormatSymbols *local_38;
  DecimalFormatSymbols *dfs_local;
  SymbolsWrapper *this_local;
  
  pDVar1 = dfs;
  doCleanup(this);
  this->fType = SYMPTR_DFS;
  pDVar1 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)pDVar1);
  local_38 = (DecimalFormatSymbols *)0x0;
  if (pDVar1 != (DecimalFormatSymbols *)0x0) {
    DecimalFormatSymbols::DecimalFormatSymbols(pDVar1,dfs);
    local_38 = pDVar1;
  }
  (this->fPtr).dfs = local_38;
  return;
}

Assistant:

void SymbolsWrapper::setTo(const DecimalFormatSymbols& dfs) {
    doCleanup();
    fType = SYMPTR_DFS;
    fPtr.dfs = new DecimalFormatSymbols(dfs);
}